

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixRead(sqlite3_file *id,void *pBuf,int amt,sqlite3_int64 offset)

{
  sqlite3_io_methods *psVar1;
  uint uVar2;
  int iVar3;
  __off64_t _Var4;
  int *piVar5;
  uint uVar6;
  void *pvVar7;
  size_t __n;
  int local_40;
  
  psVar1 = id[10].pMethods;
  if ((long)psVar1 - offset != 0 && offset <= (long)psVar1) {
    if (amt + offset <= (long)psVar1) {
      memcpy(pBuf,(void *)((long)&(id[0xd].pMethods)->iVersion + offset),(long)amt);
      return 0;
    }
    iVar3 = (int)((long)psVar1 - offset);
    __n = (size_t)iVar3;
    memcpy(pBuf,(void *)((long)&(id[0xd].pMethods)->iVersion + offset),__n);
    pBuf = (void *)((long)pBuf + __n);
    amt = amt - iVar3;
    offset = offset + __n;
  }
  local_40 = 0;
  pvVar7 = pBuf;
  uVar6 = amt;
  do {
    while( true ) {
      _Var4 = lseek64(*(int *)&id[3].pMethods,offset,0);
      if (_Var4 < 0) {
        piVar5 = __errno_location();
        *(int *)&id[4].pMethods = *piVar5;
        if (amt != 0xffffffff) {
          return 0x10a;
        }
        return 0;
      }
      uVar2 = (*aSyscall[8].pCurrent)((ulong)*(uint *)&id[3].pMethods,pvVar7,(long)(int)uVar6);
      if (uVar6 - uVar2 == 0) goto LAB_0012ceca;
      if (-1 < (int)uVar2) break;
      piVar5 = __errno_location();
      if (*piVar5 != 4) {
        *(int *)&id[4].pMethods = *piVar5;
        local_40 = 0;
        uVar6 = uVar2;
        goto LAB_0012ceca;
      }
    }
    if (uVar2 == 0) {
      uVar6 = 0;
LAB_0012ceca:
      uVar6 = uVar6 + local_40;
      iVar3 = 0;
      if (amt - uVar6 != 0) {
        if ((int)uVar6 < 0) {
          iVar3 = 0x10a;
        }
        else {
          *(undefined4 *)&id[4].pMethods = 0;
          memset((void *)((long)pBuf + (ulong)uVar6),0,(long)(int)(amt - uVar6));
          iVar3 = 0x20a;
        }
      }
      return iVar3;
    }
    offset = offset + (ulong)(uVar2 & 0x7fffffff);
    local_40 = local_40 + uVar2;
    pvVar7 = (void *)((long)pvVar7 + (ulong)(uVar2 & 0x7fffffff));
    uVar6 = uVar6 - uVar2;
  } while( true );
}

Assistant:

static int unixRead(
  sqlite3_file *id, 
  void *pBuf, 
  int amt,
  sqlite3_int64 offset
){
  unixFile *pFile = (unixFile *)id;
  int got;
  assert( id );
  assert( offset>=0 );
  assert( amt>0 );

  /* If this is a database file (not a journal, master-journal or temp
  ** file), the bytes in the locking range should never be read or written. */
#if 0
  assert( pFile->pPreallocatedUnused==0
       || offset>=PENDING_BYTE+512
       || offset+amt<=PENDING_BYTE 
  );
#endif

#if SQLITE_MAX_MMAP_SIZE>0
  /* Deal with as much of this read request as possible by transfering
  ** data from the memory mapping using memcpy().  */
  if( offset<pFile->mmapSize ){
    if( offset+amt <= pFile->mmapSize ){
      memcpy(pBuf, &((u8 *)(pFile->pMapRegion))[offset], amt);
      return SQLITE_OK;
    }else{
      int nCopy = pFile->mmapSize - offset;
      memcpy(pBuf, &((u8 *)(pFile->pMapRegion))[offset], nCopy);
      pBuf = &((u8 *)pBuf)[nCopy];
      amt -= nCopy;
      offset += nCopy;
    }
  }
#endif

  got = seekAndRead(pFile, offset, pBuf, amt);
  if( got==amt ){
    return SQLITE_OK;
  }else if( got<0 ){
    /* lastErrno set by seekAndRead */
    return SQLITE_IOERR_READ;
  }else{
    storeLastErrno(pFile, 0);   /* not a system error */
    /* Unread parts of the buffer must be zero-filled */
    memset(&((char*)pBuf)[got], 0, amt-got);
    return SQLITE_IOERR_SHORT_READ;
  }
}